

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_specification.hpp
# Opt level: O0

void chaiscript::detail::Exception_Handler_Base::throw_type<std::exception_const&>
               (Boxed_Value *bv,Dispatch_Engine *t_engine)

{
  exception *peVar1;
  exception *this;
  bad_boxed_cast *anon_var_0;
  exception *t;
  Dispatch_Engine *t_engine_local;
  Boxed_Value *bv_local;
  
  peVar1 = Dispatch_Engine::boxed_cast<std::exception_const&>(t_engine,bv);
  this = (exception *)__cxa_allocate_exception(8);
  Catch::clara::std::exception::exception(this,peVar1);
  __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void throw_type(const Boxed_Value &bv, const Dispatch_Engine &t_engine) {
        try {
          T t = t_engine.boxed_cast<T>(bv);
          throw t;
        } catch (const chaiscript::exception::bad_boxed_cast &) {
        }
      }